

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cc
# Opt level: O0

void __thiscall
google::base::CheckOpMessageBuilder::CheckOpMessageBuilder
          (CheckOpMessageBuilder *this,char *exprtext)

{
  ostringstream *this_00;
  ostream *poVar1;
  char *exprtext_local;
  CheckOpMessageBuilder *this_local;
  
  this_00 = (ostringstream *)operator_new(0x178);
  std::__cxx11::ostringstream::ostringstream(this_00);
  this->stream_ = (ostringstream *)this_00;
  poVar1 = std::operator<<((ostream *)this->stream_,exprtext);
  std::operator<<(poVar1," (");
  return;
}

Assistant:

CheckOpMessageBuilder::CheckOpMessageBuilder(const char *exprtext)
    : stream_(new ostringstream) {
  *stream_ << exprtext << " (";
}